

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void google::protobuf::FeatureSet::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  HasBits<1> *pHVar1;
  uint uVar2;
  Nullable<const_char_*> failure_msg;
  FeatureSet *_this;
  FeatureSet *local_20;
  MessageLite *local_18 [2];
  
  local_20 = (FeatureSet *)to_msg;
  local_18[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<google::protobuf::FeatureSet_const*,google::protobuf::FeatureSet*>
                          ((FeatureSet **)local_18,&local_20,"&from != _this");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_18,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x3565,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_18)
    ;
  }
  uVar2 = (uint)from_msg[2]._internal_metadata_.ptr_;
  if ((char)uVar2 != '\0') {
    if ((uVar2 & 1) != 0) {
      *(undefined4 *)((long)&local_20->field_0 + 0x20) =
           *(undefined4 *)&from_msg[3]._vptr_MessageLite;
    }
    if ((uVar2 & 2) != 0) {
      (local_20->field_0)._impl_.enum_type_ = *(int *)((long)&from_msg[3]._vptr_MessageLite + 4);
    }
    if ((uVar2 & 4) != 0) {
      *(int *)((long)&local_20->field_0 + 0x28) = (int)from_msg[3]._internal_metadata_.ptr_;
    }
    if ((uVar2 & 8) != 0) {
      (local_20->field_0)._impl_.utf8_validation_ =
           *(int *)((long)&from_msg[3]._internal_metadata_.ptr_ + 4);
    }
    if ((uVar2 & 0x10) != 0) {
      *(undefined4 *)((long)&local_20->field_0 + 0x30) =
           *(undefined4 *)&from_msg[4]._vptr_MessageLite;
    }
    if ((uVar2 & 0x20) != 0) {
      (local_20->field_0)._impl_.json_format_ = *(int *)((long)&from_msg[4]._vptr_MessageLite + 4);
    }
    if ((uVar2 & 0x40) != 0) {
      *(int *)((long)&local_20->field_0 + 0x38) = (int)from_msg[4]._internal_metadata_.ptr_;
    }
    if ((char)uVar2 < '\0') {
      (local_20->field_0)._impl_.default_symbol_visibility_ =
           *(int *)((long)&from_msg[4]._internal_metadata_.ptr_ + 4);
    }
  }
  pHVar1 = &(local_20->field_0)._impl_._has_bits_;
  pHVar1->has_bits_[0] = pHVar1->has_bits_[0] | uVar2;
  internal::ExtensionSet::MergeFrom
            (&(local_20->field_0)._impl_._extensions_,(MessageLite *)_FeatureSet_default_instance_,
             (ExtensionSet *)(from_msg + 1));
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(local_20->super_Message).super_MessageLite._internal_metadata_,
             &from_msg->_internal_metadata_);
  return;
}

Assistant:

void FeatureSet::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<FeatureSet*>(&to_msg);
  auto& from = static_cast<const FeatureSet&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FeatureSet)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_impl_.field_presence_ = from._impl_.field_presence_;
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.enum_type_ = from._impl_.enum_type_;
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.repeated_field_encoding_ = from._impl_.repeated_field_encoding_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.utf8_validation_ = from._impl_.utf8_validation_;
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.message_encoding_ = from._impl_.message_encoding_;
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.json_format_ = from._impl_.json_format_;
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _this->_impl_.enforce_naming_style_ = from._impl_.enforce_naming_style_;
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      _this->_impl_.default_symbol_visibility_ = from._impl_.default_symbol_visibility_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}